

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Intercom_Control_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Intercom_Control_PDU::Decode
          (Intercom_Control_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer *ppIVar1;
  pointer pIVar2;
  pointer pIVar3;
  iterator __position;
  KUINT16 KVar4;
  KException *this_00;
  int iVar5;
  undefined7 in_register_00000011;
  KUINT32 KVar6;
  pointer pIVar7;
  IntercomCommunicationParameters icp;
  undefined1 local_50 [32];
  
  KVar4 = KDataStream::GetBufferSize(stream);
  iVar5 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar5 = 0;
  }
  if (iVar5 + (uint)KVar4 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_50._0_8_ = local_50 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"Decode","");
    KException::KException(this_00,(KString *)local_50,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  Header7::Decode(&this->super_Header,stream,ignoreHeader);
  KDataStream::Read(stream,&(this->super_Header).super_Header6.field_0x27);
  (*(this->m_CommChannelType).super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_CommChannelType,stream);
  (*(this->m_SrcEnt).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_SrcEnt,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16SrcCommDevID);
  KDataStream::Read(stream,&this->m_ui8SrcLineID);
  KDataStream::Read(stream,&this->m_ui8TransmitPriority);
  KDataStream::Read(stream,&this->m_ui8TransmitLineState);
  KDataStream::Read(stream,&this->m_ui8Command);
  (*(this->m_MstrEntID).super_SimulationIdentifier.super_DataTypeBase._vptr_DataTypeBase[3])
            (&this->m_MstrEntID,stream);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16MstrCommDeviceID);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16MstrChannelID);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32IntrParamLen);
  pIVar2 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pIVar3 = (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pIVar7 = pIVar2;
  if (pIVar3 != pIVar2) {
    do {
      (**(pIVar7->super_DataTypeBase)._vptr_DataTypeBase)(pIVar7);
      pIVar7 = pIVar7 + 1;
    } while (pIVar7 != pIVar3);
    (this->m_vICP).
    super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar2;
  }
  KVar6 = this->m_ui32IntrParamLen;
  if (KVar6 != 0) {
    do {
      DATA_TYPE::IntercomCommunicationParameters::IntercomCommunicationParameters
                ((IntercomCommunicationParameters *)local_50,stream);
      __position._M_current =
           (this->m_vICP).
           super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_vICP).
          super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>
        ::_M_realloc_insert<KDIS::DATA_TYPE::IntercomCommunicationParameters_const&>
                  ((vector<KDIS::DATA_TYPE::IntercomCommunicationParameters,std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>>
                    *)&this->m_vICP,__position,(IntercomCommunicationParameters *)local_50);
      }
      else {
        ((__position._M_current)->super_DataTypeBase)._vptr_DataTypeBase =
             (_func_int **)&PTR__IntercomCommunicationParameters_00224950;
        (__position._M_current)->m_ui16Type = local_50._8_2_;
        (__position._M_current)->m_ui16Length = local_50._10_2_;
        *(undefined4 *)&(__position._M_current)->field_0xc = local_50._12_4_;
        (__position._M_current)->m_pRecord = (DataTypeBase *)local_50._16_8_;
        (__position._M_current)->m_bMemoryManage = (KBOOL)local_50[0x18];
        ppIVar1 = &(this->m_vICP).
                   super__Vector_base<KDIS::DATA_TYPE::IntercomCommunicationParameters,_std::allocator<KDIS::DATA_TYPE::IntercomCommunicationParameters>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        *ppIVar1 = *ppIVar1 + 1;
      }
      KVar4 = DATA_TYPE::IntercomCommunicationParameters::GetLength
                        ((IntercomCommunicationParameters *)local_50);
      DATA_TYPE::IntercomCommunicationParameters::~IntercomCommunicationParameters
                ((IntercomCommunicationParameters *)local_50);
      KVar6 = (KVar6 - KVar4) - 4;
    } while (KVar6 != 0);
  }
  return;
}

Assistant:

void Intercom_Control_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < INTERCOM_CONTROL_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Header::Decode( stream, ignoreHeader );

    stream >> m_ui8CtrlTyp
           >> KDIS_STREAM m_CommChannelType
           >> KDIS_STREAM m_SrcEnt
           >> m_ui16SrcCommDevID
           >> m_ui8SrcLineID
           >> m_ui8TransmitPriority
           >> m_ui8TransmitLineState
           >> m_ui8Command
           >> KDIS_STREAM m_MstrEntID
           >> m_ui16MstrCommDeviceID
           >> m_ui16MstrChannelID
           >> m_ui32IntrParamLen;

    m_vICP.clear();

    // Using the parameter length field to decode each parameter.
    KUINT32 ParamLength = m_ui32IntrParamLen;

    while( ParamLength )
    {
        IntercomCommunicationParameters icp( stream );

        m_vICP.push_back( icp );

        ParamLength -= icp.GetLength() + IntercomCommunicationParameters::INTERCOM_COMMS_PARAM_SIZE;
    }
}